

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool build_nest(chunk *c,loc_conflict centre,wchar_t rating)

{
  int iVar1;
  _Bool _Var2;
  uint32_t uVar3;
  wchar_t x2;
  int iVar4;
  monster_race *pmVar5;
  wchar_t wVar6;
  bool bVar7;
  wchar_t wVar8;
  uint uVar9;
  int iVar10;
  wchar_t y1;
  int iVar11;
  wchar_t x2_00;
  long lVar12;
  loc_conflict grid;
  wchar_t x1;
  monster_race *what [64];
  loc_conflict local_258;
  ulong local_250;
  ulong local_248;
  ulong local_240;
  undefined8 auStack_238 [65];
  
  local_258 = centre;
  uVar3 = Rand_div(4);
  wVar8 = uVar3 * 2 + L'\r';
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,L'\v',wVar8);
  if (((c->height <= local_258.y) || (c->width <= local_258.x)) &&
     (_Var2 = find_space(&local_258,L'\v',wVar8), !_Var2)) {
    return false;
  }
  local_248 = (ulong)local_258 & 0xffffffff;
  iVar1 = local_258.y;
  wVar8 = local_258.y + L'\xfffffffc';
  wVar6 = local_258.y + L'\x04';
  uVar9 = (int)(uVar3 * 2 + 0xb) / 2;
  x1 = local_258.x - uVar9;
  y1 = local_258.y + L'\xfffffffb';
  local_250 = CONCAT44(local_250._4_4_,local_258.y + L'\x05');
  x2 = local_258.x + uVar9;
  x2_00 = local_258.x + uVar9 + L'\x01';
  lVar12 = 0;
  local_240 = (ulong)uVar3;
  generate_room(c,y1,x1 + L'\xffffffff',local_258.y + L'\x05',x2_00,L'\0');
  draw_rectangle(c,y1,x1 + L'\xffffffff',(wchar_t)local_250,x2_00,L'\x15',L'\f',false);
  fill_rectangle(c,wVar8,x1,wVar6,x2,L'\x01',L'\0');
  wVar8 = (int)local_248 + -1 + uVar9;
  local_250 = (ulong)uVar9;
  draw_rectangle(c,iVar1 + L'\xfffffffd',x1 + L'\x01',iVar1 + L'\x03',wVar8,L'\x15',L'\v',false);
  generate_hole(c,iVar1 + L'\xfffffffd',x1 + L'\x01',iVar1 + L'\x03',wVar8,L'\x02');
  set_pit_type(c->depth,L'\x02');
  event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,dun->pit_type->name);
  wVar8 = dun->pit_type->obj_rarity;
  get_mon_num_prep(mon_pit_hook);
  bVar7 = false;
  do {
    pmVar5 = get_mon_num(c->depth + L'\n',c->depth);
    auStack_238[lVar12] = pmVar5;
    if (pmVar5 == (monster_race *)0x0) {
      bVar7 = true;
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x40);
  _Var2 = false;
  get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
  if (!bVar7) {
    if ((player->opts).opt[0x18] == true) {
      msg("Monster nest (%s)",dun->pit_type->name);
    }
    add_to_monster_rating(c,dun->pit_type->ave / 0x14 + (int)local_240);
    local_248 = CONCAT44(local_248._4_4_,(int)local_250 * 2 + -3);
    iVar4 = iVar1 + -2;
    do {
      if (x1 + L'\x02' <= x2 + L'\xfffffffe') {
        iVar10 = (int)local_248;
        iVar11 = x1 + L'\x02';
        do {
          uVar3 = Rand_div(0x40);
          grid.y = iVar4;
          grid.x = iVar11;
          place_new_monster(c,grid,(monster_race *)auStack_238[(int)uVar3],false,false,
                            (monster_group_info)0x0,'\f');
          wVar6 = Rand_div(100);
          if (wVar6 < wVar8) {
            wVar6 = c->depth;
            uVar3 = Rand_div(3);
            place_object((chunk_conflict *)c,grid,wVar6 + L'\n',uVar3 == 0,false,'\x04',L'\0');
          }
          iVar11 = iVar11 + 1;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      bVar7 = iVar4 < iVar1 + 2;
      iVar4 = iVar4 + 1;
    } while (bVar7);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool build_nest(struct chunk *c, struct loc centre, int rating)
{
	struct loc grid;
	int y1, x1, y2, x2;
	int i;
	int alloc_obj;
	struct monster_race *what[64];
	bool empty = false;
	int light = false;
	int size_vary = randint0(4);
	int height = 9;
	int width = 11 + 2 * size_vary;
	struct monster_group_info info = {0, 0};

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Large room */
	y1 = centre.y - height / 2;
	y2 = centre.y + height / 2;
	x1 = centre.x - width / 2;
	x2 = centre.x + width / 2;

	/* Generate new room */
	generate_room(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, light);

	/* Generate outer walls */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);

	/* Generate inner floors */
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	/* Advance to the center room */
	y1 = y1 + 2;
	y2 = y2 - 2;
	x1 = x1 + 2;
	x2 = x2 - 2;

	/* Generate inner walls; add one door as entrance */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_INNER, false);
	generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

	/* Decide on the pit type */
	set_pit_type(c->depth, 2);
	event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, dun->pit_type->name);

	/* Chance of objects on the floor */
	alloc_obj = dun->pit_type->obj_rarity;
	
	/* Prepare allocation table */
	get_mon_num_prep(mon_pit_hook);

	/* Pick some monster types */
	for (i = 0; i < 64; i++) {
		/* Get a (hard) monster type */
		what[i] = get_mon_num(c->depth + 10, c->depth);

		/* Notice failure */
		if (!what[i]) empty = true;
	}

	/* Prepare allocation table */
	get_mon_num_prep(NULL);

	/* Oops */
	if (empty) return false;

	/* Describe */
	ROOM_LOG("Monster nest (%s)", dun->pit_type->name);

	/* Increase the level rating */
	add_to_monster_rating(c, size_vary + dun->pit_type->ave / 20);

	/* Place some monsters */
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			/* Figure out what monster is being used, and place that monster */
			struct monster_race *race = what[randint0(64)];
			place_new_monster(c, grid, race, false, false, info,
							  ORIGIN_DROP_PIT);

			/* Occasionally place an item, making it good 1/3 of the time */
			if (randint0(100) < alloc_obj) 
				place_object(c, grid, c->depth + 10, one_in_(3), false,
							 ORIGIN_PIT, 0);
		}
	}

	return true;
}